

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O2

secp256k1_xonly_pubkey *
cfd::core::ParseXOnlyPubkey(secp256k1_xonly_pubkey *__return_storage_ptr__,SchnorrPubkey *pubkey)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  string local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  ctx = wally_get_secp_context();
  SchnorrPubkey::GetData((ByteData *)&local_40,pubkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
                     (ByteData *)&local_40);
  iVar1 = secp256k1_xonly_pubkey_parse
                    (ctx,__return_storage_ptr__,(uchar *)local_60._M_dataplus._M_p);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  if (iVar1 == 1) {
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_60,"Could not parse xonly pubkey",(allocator *)&local_40);
  CfdException::CfdException(this,kCfdInternalError,&local_60);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

secp256k1_xonly_pubkey ParseXOnlyPubkey(const SchnorrPubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey;

  auto ret = secp256k1_xonly_pubkey_parse(
      ctx, &xonly_pubkey, pubkey.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not parse xonly pubkey");
  }

  return xonly_pubkey;
}